

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rs_internal.h
# Opt level: O0

uint * calculate_check_symbols(uint *M,uint m_len,uint *G,uint g_len,uint t,uint *new_len)

{
  uint *a_00;
  uint *b;
  uint *puVar1;
  uint *v;
  uint *a;
  uint *r;
  uint r_len;
  uint a_len;
  uint *new_len_local;
  uint t_local;
  uint g_len_local;
  uint *G_local;
  uint *puStack_18;
  uint m_len_local;
  uint *M_local;
  
  r._4_4_ = m_len + t * -2;
  _r_len = new_len;
  new_len_local._0_4_ = t;
  new_len_local._4_4_ = g_len;
  _t_local = G;
  G_local._4_4_ = m_len;
  puStack_18 = M;
  if (r._4_4_ == 0) {
    M_local = gf_polydiv(M,m_len,G,g_len,new_len);
  }
  else {
    r._0_4_ = 0;
    a_00 = gf_polydiv(M,m_len,G,g_len,(uint *)&r);
    b = vector_new(r._4_4_ + ((uint)new_len_local * 2 - (uint)r));
    puVar1 = stack(a_00,(uint)r,b,r._4_4_ + ((uint)new_len_local * 2 - (uint)r),_r_len);
    vector_free(b);
    vector_free(a_00);
    M_local = puVar1;
  }
  return M_local;
}

Assistant:

uint32_t *calculate_check_symbols(uint32_t *M, uint32_t m_len, uint32_t *G, uint32_t g_len, uint32_t t, uint32_t *new_len)
{
    uint32_t a_len = m_len - 2 * t;
    if (a_len <= 0)
        return gf_polydiv(M, m_len, G, g_len, new_len);

    uint32_t r_len = 0;
    uint32_t *r = gf_polydiv(M, m_len, G, g_len, &r_len);

    uint32_t *a = vector_new(a_len + (2*t-r_len));
    
    uint32_t *v = stack(r, r_len, a, a_len + (2*t-r_len), new_len);

    vector_free(a);
    vector_free(r);

    return v;
}